

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::parlocalpar(Forth *this)

{
  bool bVar1;
  char cVar2;
  CAddr CVar3;
  size_type sVar4;
  undefined1 local_90 [4];
  CAddr dataAddress;
  localVariable variable;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  undefined1 local_38 [8];
  string localName;
  uint address;
  uint u;
  Forth *this_local;
  
  requireDStackDepth(this,2,"(LOCAL)");
  localName.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  localName.field_2._8_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (localName.field_2._12_4_ != 0) {
    std::__cxx11::string::string((string *)local_38);
    moveFromDataSpace(this,(string *)local_38,localName.field_2._8_4_,
                      (ulong)(uint)localName.field_2._12_4_);
    __end3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&c);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      variable._32_8_ =
           __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end3);
      cVar2 = toupper_ascii(*(char *)variable._32_8_);
      *(char *)variable._32_8_ = cVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::__cxx11::string::string((string *)local_90);
    variable.localName.field_2._8_4_ = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    align(this);
    CVar3 = getDataPointer(this);
    variable.localName.field_2._8_4_ = CVar3 + this->CellSize * 3;
    std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
    push_back(&this->localVariables,(value_type *)local_90);
    data(this,0x18);
    data(this,5);
    data(this,this->CellSize * 3);
    data(this,4);
    sVar4 = std::
            vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
            ::size(&this->localVariables);
    data(this,(int)sVar4 - 1);
    localVariable::~localVariable((localVariable *)local_90);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void parlocalpar(){
			REQUIRE_DSTACK_DEPTH(2, "(LOCAL)");
			auto u=dStack.getTop(); dStack.pop();
			auto address=dStack.getTop(); dStack.pop();
			if(u>0){
			std::string localName{};
			moveFromDataSpace(localName,address,u);
			for(auto &c: localName) c=toupper_ascii(c);
			struct localVariable variable{};
			variable.localName=localName;
			align();// in case data() makes alignment;
			auto dataAddress=getDataPointer();
			variable.localAddress=dataAddress+CellSize*3;	
			localVariables.push_back(variable);		
			//data(doLiteralXt); // 1 literal
			//data(dataAddress+CellSize*6);  // 2 address
			//data(storeXt);  // 3 @
			data(localToReturnStackXt);
			data(branchXt);	// 4 	
			data(CellSize * 3);	// 5 Jump 5 to 8 
			data(4);			// 6
			data(localVariables.size()-1);	// 7 init by number of local variable (0,1,)
			}
		}